

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintEnum
          (Generator *this,EnumDescriptor *enum_descriptor,EnumDescriptorProto *proto)

{
  size_t *psVar1;
  bool *pbVar2;
  ushort *puVar3;
  Printer *pPVar4;
  EnumValueDescriptor *pEVar5;
  size_t sVar6;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>_>
  *proto_00;
  char *pcVar7;
  undefined1 *this_00;
  long lVar8;
  long lVar9;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view serialized_options;
  string options_string;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string module_level_descriptor_name;
  EnumDescriptorProto edp;
  char enum_descriptor_template [183];
  string local_1c8;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a8;
  string local_180;
  EnumDescriptorProto local_160;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_e8 [7];
  
  local_1a8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  local_1a8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  local_1a8.settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>(&local_180,this,enum_descriptor);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[16]>(local_e8,&local_1a8,(char (*) [16])0x565102);
  std::__cxx11::string::_M_assign((string *)((long)local_e8[0].first.field_1.slot_ + 0x10));
  puVar3 = (ushort *)(enum_descriptor->all_names_).payload_;
  pbVar2 = &local_e8[0].second;
  local_e8[0].first.ctrl_ = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,(long)puVar3 + ~(ulong)*puVar3,(long)puVar3 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_160,&local_1a8,(char (*) [5])0x7203be);
  std::__cxx11::string::operator=
            ((string *)(local_160.super_Message.super_MessageLite._internal_metadata_.ptr_ + 0x10),
             (string *)local_e8);
  if ((bool *)local_e8[0].first.ctrl_ != pbVar2) {
    operator_delete(local_e8[0].first.ctrl_,local_e8[0]._16_8_ + 1);
  }
  pcVar7 = (enum_descriptor->all_names_).payload_;
  local_e8[0].first.ctrl_ = pbVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_e8,pcVar7 + ~(ulong)*(ushort *)(pcVar7 + 2),pcVar7 + -1);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>
            ((pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
              *)&local_160,&local_1a8,(char (*) [10])0x6a5b99);
  std::__cxx11::string::operator=
            ((string *)(local_160.super_Message.super_MessageLite._internal_metadata_.ptr_ + 0x10),
             (string *)local_e8);
  if ((bool *)local_e8[0].first.ctrl_ != pbVar2) {
    operator_delete(local_e8[0].first.ctrl_,local_e8[0]._16_8_ + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[5]>(local_e8,&local_1a8,(char (*) [5])0x55595f);
  std::__cxx11::string::_M_replace
            ((long)local_e8[0].first.field_1.slot_ + 0x10,0,
             *(char **)((long)local_e8[0].first.field_1.slot_ + 0x18),0x563cd8);
  memcpy(local_e8,
         "$descriptor_name$ = _descriptor.EnumDescriptor(\n  name=\'$name$\',\n  full_name=\'$full_name$\',\n  filename=None,\n  file=$file$,\n  create_key=_descriptor._internal_create_key,\n  values=[\n"
         ,0xb7);
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  this_00 = (undefined1 *)(proto->field_0)._impl_.options_;
  if ((EnumOptions *)this_00 == (EnumOptions *)0x0) {
    this_00 = _EnumOptions_default_instance_;
  }
  MessageLite::SerializeToString((MessageLite *)this_00,&local_1c8);
  pPVar4 = this->printer_;
  sVar6 = strlen((char *)local_e8);
  text_06._M_str = (char *)local_e8;
  text_06._M_len = sVar6;
  io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar4,(flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_1a8,text_06);
  pcVar7 = (char *)((this->printer_->options_).spaces_per_indent * 2);
  psVar1 = &this->printer_->indent_;
  *psVar1 = (size_t)(pcVar7 + *psVar1);
  if (0 < enum_descriptor->value_count_) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      pEVar5 = enum_descriptor->values_;
      proto_00 = protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::EnumValueDescriptorProto>>
                           (&(proto->field_0)._impl_.value_.super_RepeatedPtrFieldBase,(int)lVar8);
      PrintEnumValueDescriptor
                (this,(EnumValueDescriptor *)(&pEVar5->super_SymbolBaseN<0> + lVar9),proto_00);
      text._M_str = ",\n";
      text._M_len = 2;
      io::Printer::Print<>(this->printer_,text);
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0x30;
    } while (lVar8 < enum_descriptor->value_count_);
  }
  io::Printer::Outdent(this->printer_);
  text_00._M_str = "],\n";
  text_00._M_len = 3;
  io::Printer::Print<>(this->printer_,text_00);
  text_01._M_str = "containing_type=None,\n";
  text_01._M_len = 0x16;
  io::Printer::Print<>(this->printer_,text_01);
  pPVar4 = this->printer_;
  serialized_options._M_str = pcVar7;
  serialized_options._M_len = (size_t)local_1c8._M_dataplus._M_p;
  python::(anonymous_namespace)::OptionsValue_abi_cxx11_
            ((string *)&local_160,(_anonymous_namespace_ *)local_1c8._M_string_length,
             serialized_options);
  text_02._M_str = "serialized_options=$options_value$,\n";
  text_02._M_len = 0x24;
  io::Printer::Print<char[14],std::__cxx11::string>
            (pPVar4,text_02,(char (*) [14])"options_value",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_160);
  if ((anon_union_104_1_493b367e_for_EnumDescriptorProto_3 *)
      local_160.super_Message.super_MessageLite._vptr_MessageLite != &local_160.field_0) {
    operator_delete(local_160.super_Message.super_MessageLite._vptr_MessageLite,
                    local_160.field_0._0_8_ + 1);
  }
  EnumDescriptorProto::EnumDescriptorProto(&local_160,(Arena *)0x0);
  io::Printer::Outdent(this->printer_);
  text_03._M_str = ")\n";
  text_03._M_len = 2;
  io::Printer::Print<>(this->printer_,text_03);
  text_04._M_str = "_sym_db.RegisterEnumDescriptor($name$)\n";
  text_04._M_len = 0x27;
  io::Printer::Print<char[5],std::__cxx11::string>
            (this->printer_,text_04,(char (*) [5])0x7203be,&local_180);
  text_05._M_str = "\n";
  text_05._M_len = 1;
  io::Printer::Print<>(this->printer_,text_05);
  EnumDescriptorProto::~EnumDescriptorProto(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,
                    CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                             local_1c8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p,local_180.field_2._M_allocated_capacity + 1);
  }
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set(&local_1a8);
  return;
}

Assistant:

void Generator::PrintEnum(const EnumDescriptor& enum_descriptor,
                          const EnumDescriptorProto& proto) const {
  absl::flat_hash_map<absl::string_view, std::string> m;
  std::string module_level_descriptor_name =
      ModuleLevelDescriptorName(enum_descriptor);
  m["descriptor_name"] = module_level_descriptor_name;
  m["name"] = std::string(enum_descriptor.name());
  m["full_name"] = std::string(enum_descriptor.full_name());
  m["file"] = kDescriptorKey;
  const char enum_descriptor_template[] =
      "$descriptor_name$ = _descriptor.EnumDescriptor(\n"
      "  name='$name$',\n"
      "  full_name='$full_name$',\n"
      "  filename=None,\n"
      "  file=$file$,\n"
      "  create_key=_descriptor._internal_create_key,\n"
      "  values=[\n";
  std::string options_string;
  proto.options().SerializeToString(&options_string);
  printer_->Print(m, enum_descriptor_template);
  printer_->Indent();
  printer_->Indent();

  for (int i = 0; i < enum_descriptor.value_count(); ++i) {
    PrintEnumValueDescriptor(*enum_descriptor.value(i), proto.value(i));
    printer_->Print(",\n");
  }

  printer_->Outdent();
  printer_->Print("],\n");
  printer_->Print("containing_type=None,\n");
  printer_->Print("serialized_options=$options_value$,\n", "options_value",
                  OptionsValue(options_string));
  EnumDescriptorProto edp;
  printer_->Outdent();
  printer_->Print(")\n");
  printer_->Print("_sym_db.RegisterEnumDescriptor($name$)\n", "name",
                  module_level_descriptor_name);
  printer_->Print("\n");
}